

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absDup.c
# Opt level: O2

void Gia_ManPrintObjClasses(Gia_Man_t *p)

{
  Vec_Int_t *p_00;
  int *__s;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint *__ptr;
  int *__ptr_00;
  Vec_Int_t *p_01;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int i;
  long lVar11;
  uint uVar12;
  int nCap;
  long lVar13;
  size_t __size;
  uint *local_70;
  long local_68;
  
  p_00 = p->vObjClasses;
  if (p_00 == (Vec_Int_t *)0x0) {
    return;
  }
  uVar1 = Vec_IntEntry(p_00,0);
  iVar2 = Vec_IntEntry(p_00,uVar1 + 1);
  if (iVar2 != p_00->nSize) {
    __assert_fail("Vec_IntEntry(vAbs, nFrames+1) == Vec_IntSize(vAbs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absDup.c"
                  ,0x17a,"void Gia_ManPrintObjClasses(Gia_Man_t *)");
  }
  __size = (long)(int)(uVar1 + 1) << 2;
  __ptr = (uint *)malloc(__size);
  __ptr_00 = (int *)malloc(__size);
  iVar2 = (((int)uVar1 >> 5) + 1) - (uint)((uVar1 & 0x1f) == 0);
  lVar13 = (long)iVar2 * (long)p->nObjs;
  nCap = (int)lVar13;
  p_01 = Vec_IntAlloc(nCap);
  p_01->nSize = nCap;
  __s = p_01->pArray;
  if (__s != (int *)0x0) {
    memset(__s,0,lVar13 * 4);
  }
  uVar9 = p->nObjs;
  uVar8 = uVar9;
  if (1 < uVar9) {
    uVar8 = 0;
    for (uVar12 = uVar9 - 1; uVar12 != 0; uVar12 = uVar12 >> 1) {
      uVar8 = uVar8 + 1;
    }
  }
  iVar4 = -1;
  uVar12 = ~(-1 << ((byte)uVar8 & 0x1f));
  if ((int)uVar12 < (int)uVar9) {
    __assert_fail("Gia_ManObjNum(p) <= nObjMask",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absDup.c"
                  ,0x183,"void Gia_ManPrintObjClasses(Gia_Man_t *)");
  }
  puts("Frame   Core   F0   F1   F2   F3 ...");
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  local_70 = __ptr + -3;
  iVar7 = 1;
  lVar13 = 4;
  local_68 = 4;
  uVar10 = 0;
  do {
    uVar9 = (uint)uVar10;
    if (uVar9 == uVar1) {
      if (iVar4 != p_00->nSize) {
        __assert_fail("iStop == Vec_IntSize(vAbs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absDup.c"
                      ,0x1b1,"void Gia_ManPrintObjClasses(Gia_Man_t *)");
      }
      Vec_IntFree(p_01);
      free(__ptr);
      free(__ptr_00);
      return;
    }
    iVar3 = Vec_IntEntry(p_00,uVar9 + 1);
    iVar4 = Vec_IntEntry(p_00,uVar9 + 2);
    memset(__ptr,0,__size);
    memset(__ptr_00,0,__size);
    for (i = iVar3; i < iVar4; i = i + 1) {
      uVar5 = Vec_IntEntry(p_00,i);
      uVar6 = (int)uVar5 >> ((byte)uVar8 & 0x1f);
      uVar5 = (uVar5 & uVar12) * iVar2;
      if (((int)uVar5 < 0) || (nCap <= (int)uVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      if (((uint)__s[(ulong)uVar5 + (long)((int)uVar6 >> 5)] >> (uVar6 & 0x1f) & 1) == 0) {
        __s[(ulong)uVar5 + (long)((int)uVar6 >> 5)] =
             __s[(ulong)uVar5 + (long)((int)uVar6 >> 5)] | 1 << ((byte)uVar6 & 0x1f);
        __ptr_00[(long)(int)uVar6 + 1] = __ptr_00[(long)(int)uVar6 + 1] + 1;
        *__ptr_00 = *__ptr_00 + 1;
      }
      __ptr[(long)(int)uVar6 + 1] = __ptr[(long)(int)uVar6 + 1] + 1;
      *__ptr = *__ptr + 1;
    }
    uVar5 = *__ptr;
    if (uVar5 != iVar4 - iVar3) {
      __assert_fail("pCountAll[0] == (iStop - iStart)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absDup.c"
                    ,0x19a,"void Gia_ManPrintObjClasses(Gia_Man_t *)");
    }
    printf("%3d :",uVar10);
    printf("%7d",(ulong)uVar5);
    if (uVar9 < 10) {
      for (lVar11 = 0; local_68 != lVar11; lVar11 = lVar11 + 4) {
        printf("%5d",(ulong)*(uint *)((long)__ptr + lVar11 + 4));
      }
    }
    else {
      for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
        printf("%5d",(ulong)__ptr[lVar11 + 1]);
      }
      printf("  ...");
      for (lVar11 = 0; iVar7 + lVar13 != lVar11; lVar11 = lVar11 + 1) {
        printf("%5d",(ulong)local_70[lVar11]);
      }
    }
    putchar(10);
    iVar7 = iVar7 + 1;
    local_68 = local_68 + 4;
    lVar13 = lVar13 + -1;
    local_70 = local_70 + 1;
    uVar10 = (ulong)(uVar9 + 1);
  } while( true );
}

Assistant:

void Gia_ManPrintObjClasses( Gia_Man_t * p )
{
    Vec_Int_t * vSeens;  // objects seen so far
    Vec_Int_t * vAbs = p->vObjClasses;
    int i, k, Entry, iStart, iStop = -1, nFrames;
    int nObjBits, nObjMask, iObj, iFrame, nWords;
    unsigned * pInfo;
    int * pCountAll, * pCountUni;
    if ( vAbs == NULL )
        return;
    nFrames = Vec_IntEntry( vAbs, 0 );
    assert( Vec_IntEntry(vAbs, nFrames+1) == Vec_IntSize(vAbs) );
    pCountAll = ABC_ALLOC( int, nFrames + 1 );
    pCountUni = ABC_ALLOC( int, nFrames + 1 );
    // start storage for seen objects
    nWords = Abc_BitWordNum( nFrames );
    vSeens = Vec_IntStart( Gia_ManObjNum(p) * nWords );
    // get the bitmasks
    nObjBits = Abc_Base2Log( Gia_ManObjNum(p) );
    nObjMask = (1 << nObjBits) - 1;
    assert( Gia_ManObjNum(p) <= nObjMask );
    // print info about frames
    printf( "Frame   Core   F0   F1   F2   F3 ...\n" );
    for ( i = 0; i < nFrames; i++ )
    {
        iStart = Vec_IntEntry( vAbs, i+1 );
        iStop  = Vec_IntEntry( vAbs, i+2 );
        memset( pCountAll, 0, sizeof(int) * (nFrames + 1) );
        memset( pCountUni, 0, sizeof(int) * (nFrames + 1) );
        Vec_IntForEachEntryStartStop( vAbs, Entry, k, iStart, iStop )
        {
            iObj   = (Entry &  nObjMask);
            iFrame = (Entry >> nObjBits);
            pInfo  = (unsigned *)Vec_IntEntryP( vSeens, nWords * iObj );
            if ( Abc_InfoHasBit(pInfo, iFrame) == 0 )
            {
                Abc_InfoSetBit( pInfo, iFrame );
                pCountUni[iFrame+1]++;
                pCountUni[0]++;
            }
            pCountAll[iFrame+1]++;
            pCountAll[0]++;
        }
        assert( pCountAll[0] == (iStop - iStart) );
//        printf( "%5d%5d  ", pCountAll[0], pCountUni[0] ); 
        printf( "%3d :", i );
        printf( "%7d", pCountAll[0] ); 
        if ( i >= 10 )
        {
            for ( k = 0; k < 4; k++ )
                printf( "%5d", pCountAll[k+1] ); 
            printf( "  ..." );
            for ( k = i-4; k <= i; k++ )
                printf( "%5d", pCountAll[k+1] ); 
        }
        else
        {
            for ( k = 0; k <= i; k++ )
                if ( k <= i )
                    printf( "%5d", pCountAll[k+1] ); 
        }
//        for ( k = 0; k < nFrames; k++ )
//            if ( k <= i )
//                printf( "%5d", pCountAll[k+1] ); 
        printf( "\n" );
    }
    assert( iStop == Vec_IntSize(vAbs) );
    Vec_IntFree( vSeens );
    ABC_FREE( pCountAll );
    ABC_FREE( pCountUni );
}